

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

PktOut * ssh2_chanreq_init(ssh2_channel *c,char *type,cr_handler_fn_t handler,void *ctx)

{
  BinarySink *bs;
  PktOut *pPVar1;
  outstanding_channel_request *poVar2;
  outstanding_channel_request **ppoVar3;
  
  if ((c->closes & 10) == 0) {
    pPVar1 = (*((c->connlayer->ppl).bpp)->vt->new_pktout)(0x62);
    bs = pPVar1->binarysink_;
    BinarySink_put_uint32(bs,(ulong)c->remoteid);
    BinarySink_put_stringz(bs,type);
    BinarySink_put_bool(bs,handler != (cr_handler_fn_t)0x0);
    if (handler != (cr_handler_fn_t)0x0) {
      poVar2 = (outstanding_channel_request *)safemalloc(1,0x18,0);
      poVar2->handler = handler;
      poVar2->ctx = ctx;
      poVar2->next = (outstanding_channel_request *)0x0;
      if (c->chanreq_head == (outstanding_channel_request *)0x0) {
        ppoVar3 = &c->chanreq_head;
      }
      else {
        ppoVar3 = &c->chanreq_tail->next;
      }
      *ppoVar3 = poVar2;
      c->chanreq_tail = poVar2;
    }
    return pPVar1;
  }
  __assert_fail("!(c->closes & (CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE))",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                ,0x538,
                "PktOut *ssh2_chanreq_init(struct ssh2_channel *, const char *, cr_handler_fn_t, void *)"
               );
}

Assistant:

PktOut *ssh2_chanreq_init(struct ssh2_channel *c, const char *type,
                          cr_handler_fn_t handler, void *ctx)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;

    assert(!(c->closes & (CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE)));
    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_REQUEST);
    put_uint32(pktout, c->remoteid);
    put_stringz(pktout, type);
    put_bool(pktout, handler != NULL);
    if (handler != NULL) {
        struct outstanding_channel_request *ocr =
            snew(struct outstanding_channel_request);

        ocr->handler = handler;
        ocr->ctx = ctx;
        ocr->next = NULL;
        if (!c->chanreq_head)
            c->chanreq_head = ocr;
        else
            c->chanreq_tail->next = ocr;
        c->chanreq_tail = ocr;
    }
    return pktout;
}